

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void add_include_stream(c2m_ctx_t c2m_ctx,char *fname,char *content,pos_t err_pos)

{
  pre_ctx *ppVar1;
  VARR_char_ptr_t *pVVar2;
  size_t sVar3;
  char_ptr_t *ppcVar4;
  stream_t psVar5;
  VARR_ifstate_t *pVVar6;
  int iVar7;
  FILE *f;
  size_t sVar8;
  
  ppVar1 = c2m_ctx->pre_ctx;
  pVVar2 = ppVar1->once_include_files;
  if (pVVar2 == (VARR_char_ptr_t *)0x0) {
LAB_00192c68:
    add_include_stream_cold_3();
LAB_00192c6d:
    __assert_fail("fname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x89b,"void add_include_stream(c2m_ctx_t, const char *, const char *, pos_t)");
  }
  sVar3 = pVVar2->els_num;
  if (sVar3 != 0) {
    ppcVar4 = pVVar2->varr;
    sVar8 = 0;
    do {
      if (ppcVar4 == (char_ptr_t *)0x0) {
        add_include_stream_cold_1();
        goto LAB_00192c68;
      }
      iVar7 = strcmp(fname,ppcVar4[sVar8]);
      if (iVar7 == 0) {
        return;
      }
      sVar8 = sVar8 + 1;
    } while (sVar3 != sVar8);
  }
  if (fname == (char *)0x0) goto LAB_00192c6d;
  if (content == (char *)0x0) {
    f = fopen(fname,"rb");
    if (f == (FILE *)0x0) goto LAB_00192c91;
    add_stream(c2m_ctx,(FILE *)f,fname,(_func_int_c2m_ctx_t *)0x0);
  }
  else {
    add_stream(c2m_ctx,(FILE *)0x0,fname,str_getc);
    psVar5 = c2m_ctx->cs;
    psVar5->curr = content;
    psVar5->start = content;
  }
  pVVar6 = ppVar1->ifs;
  if (pVVar6 != (VARR_ifstate_t *)0x0) {
    c2m_ctx->cs->ifs_length_at_stream_start = (int)pVVar6->els_num;
    return;
  }
  add_include_stream_cold_2();
LAB_00192c91:
  if (c2m_ctx->options->message_file != (FILE *)0x0) {
    error(c2m_ctx,0x1c18b5,err_pos.fname,err_pos._8_8_,fname);
  }
  longjmp((__jmp_buf_tag *)c2m_ctx->env,1);
}

Assistant:

static void add_include_stream (c2m_ctx_t c2m_ctx, const char *fname, const char *content,
                                pos_t err_pos) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  FILE *f;

  for (size_t i = 0; i < VARR_LENGTH (char_ptr_t, once_include_files); i++)
    if (strcmp (fname, VARR_GET (char_ptr_t, once_include_files, i)) == 0) return;
  assert (fname != NULL);
  if (content == NULL && (f = fopen (fname, "rb")) == NULL) {
    if (c2m_options->message_file != NULL)
      error (c2m_ctx, err_pos, "error in opening file %s", fname);
    longjmp (c2m_ctx->env, 1);  // ???
  }
  if (content == NULL)
    add_stream (c2m_ctx, f, fname, NULL);
  else
    add_string_stream (c2m_ctx, fname, content);
  cs->ifs_length_at_stream_start = (int) VARR_LENGTH (ifstate_t, ifs);
}